

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O1

void WasmCGenBinary(WasmCGen *cgen,PCSTR function)

{
  w3SourceGenStack *this;
  long *plVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  size_type *psVar4;
  ulong uVar5;
  undefined8 uVar6;
  allocator<char> local_121;
  long *local_120;
  undefined8 local_118;
  long local_110;
  undefined8 uStack_108;
  long *local_100;
  undefined8 local_f8;
  long local_f0;
  undefined8 uStack_e8;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  long lStack_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  string local_a0;
  string local_80;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  printf("/*%s*/\n","WasmCGenBinary");
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,function,&local_121);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_40);
  puVar3 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar3) {
    local_d0 = *puVar3;
    lStack_c8 = plVar1[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar3;
    local_e0 = (ulong *)*plVar1;
  }
  local_d8 = plVar1[1];
  *plVar1 = (long)puVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  this = &(cgen->super_w3SourceGen).stack;
  w3SourceGenStack::pop_abi_cxx11_(&local_80,this);
  uVar5 = 0xf;
  if (local_e0 != &local_d0) {
    uVar5 = local_d0;
  }
  if (uVar5 < local_80._M_string_length + local_d8) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar6 = local_80.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_80._M_string_length + local_d8) goto LAB_00115953;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_e0);
  }
  else {
LAB_00115953:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_80._M_dataplus._M_p);
  }
  local_120 = &local_110;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_110 = *plVar1;
    uStack_108 = puVar2[3];
  }
  else {
    local_110 = *plVar1;
    local_120 = (long *)*puVar2;
  }
  local_118 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_120);
  puVar3 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar3) {
    local_b0 = *puVar3;
    lStack_a8 = plVar1[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar3;
    local_c0 = (ulong *)*plVar1;
  }
  local_b8 = plVar1[1];
  *plVar1 = (long)puVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  w3SourceGenStack::pop_abi_cxx11_(&local_a0,this);
  uVar5 = 0xf;
  if (local_c0 != &local_b0) {
    uVar5 = local_b0;
  }
  if (uVar5 < local_a0._M_string_length + local_b8) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      uVar6 = local_a0.field_2._M_allocated_capacity;
    }
    if (local_a0._M_string_length + local_b8 <= (ulong)uVar6) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0);
      goto LAB_00115a97;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0._M_dataplus._M_p);
LAB_00115a97:
  local_100 = &local_f0;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_f0 = *plVar1;
    uStack_e8 = puVar2[3];
  }
  else {
    local_f0 = *plVar1;
    local_100 = (long *)*puVar2;
  }
  local_f8 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar4 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60.field_2._8_8_ = plVar1[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_60._M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  w3SourceGen::push(&cgen->super_w3SourceGen,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void WasmCGenBinary (WasmCGen* cgen, PCSTR function)
{
    printf ("/*%s*/\n", __func__);
    cgen->push (string (function) + "(" + cgen->pop () + "," + cgen->pop () + ")");
}